

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

int lest::run(tests *specification,texts *arguments,ostream *os)

{
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> _Var1;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  times *ptVar7;
  confirm *pcVar8;
  size_t __i;
  ulong uVar9;
  long lVar10;
  tms *__buffer;
  int in_R8D;
  texts in;
  count count_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_14e8;
  tests local_14e0;
  vector<lest::test,_std::allocator<lest::test>_> local_14c8;
  undefined1 local_14b0 [24];
  vector<lest::test,_std::allocator<lest::test>_> local_1498;
  tests local_1480;
  vector<lest::test,_std::allocator<lest::test>_> local_1468;
  tests local_1450;
  vector<lest::test,_std::allocator<lest::test>_> local_1438;
  tests local_1420;
  vector<lest::test,_std::allocator<lest::test>_> local_1408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13d8;
  undefined1 local_13b8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13a0;
  unsigned_long uStack_1388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1380;
  pointer local_1370;
  pointer pbStack_1368;
  pointer local_1360;
  unsigned_long uStack_1358;
  size_t local_38;
  
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_13f0,arguments);
  split_arguments((pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_13b8,&local_13f0);
  uVar4 = local_13b8._8_8_;
  uVar3 = local_13b8._0_8_;
  local_13d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1508.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_13d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1508.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_13d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1508.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pcVar8 = (confirm *)((ulong)local_13b8._8_8_ >> 0x20);
  local_14e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_13b8._16_8_;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_13a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_13a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1508.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_13a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_13a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_13d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_13a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_13f0);
  if ((uVar4 & 1) != 0) {
    _Var1._M_current =
         (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
         super__Vector_impl_data._M_start;
    _Var2._M_current =
         (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (_Var1._M_current != _Var2._M_current) {
      uVar9 = ((long)_Var2._M_current - (long)_Var1._M_current >> 3) * -0x3333333333333333;
      lVar10 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(lest::test_const&,lest::test_const&)>>
                (_Var1,_Var2,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_lest::test_&,_const_lest::test_&)>)0x10e80b);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(lest::test_const&,lest::test_const&)>>
                (_Var1,_Var2,
                 (_Iter_comp_iter<bool_(*)(const_lest::test_&,_const_lest::test_&)>)0x10e80b);
    }
  }
  if ((uVar4 & 0x100) != 0) {
    _Var1._M_current =
         (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
         super__Vector_impl_data._M_start;
    _Var2._M_current =
         (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_13b8._0_8_ = (ulong)local_14e8 & 0xffffffff;
    lVar10 = 1;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_13b8._0_8_;
    do {
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)(((uint)((ulong)paVar6 >> 0x1e) ^ (uint)paVar6) * 0x6c078965 + (int)lVar10)
      ;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(local_13b8 + lVar10 * 8) = paVar6;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x270);
    local_38 = 0x270;
    std::
    shuffle<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (_Var1,_Var2,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_13b8);
  }
  if ((uVar3 & 1) == 0) {
    if ((uVar4 & 0x1000000) == 0) {
      if ((uVar3 & 0x10000) == 0) {
        if ((uVar3 & 0x1000000) == 0) {
          if ((uVar3 & 0x100000000) == 0) {
            if ((uVar3 & 0x10000000000) == 0) {
              local_13a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_1380;
              local_13b8._16_8_ = uVar3;
              local_13a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar4;
              local_13a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_14e8;
              uStack_1388 = 0;
              local_1380._M_local_buf[0] = '\0';
              local_1370 = (pointer)0x0;
              pbStack_1368 = (pointer)0x0;
              local_1360 = (pointer)0x0;
              uStack_1358 = 0;
              local_13b8._0_8_ = os;
              local_13b8._8_8_ = os;
              std::vector<lest::test,_std::allocator<lest::test>_>::vector
                        (&local_14c8,specification);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_14e0,&local_1508);
              pcVar8 = for_test<lest::confirm>
                                 ((lest *)&local_14c8,&local_14e0,(texts *)local_13b8,pcVar8,in_R8D)
              ;
              iVar5 = pcVar8->failures;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_14e0);
              std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_14c8);
              confirm::~confirm((confirm *)local_13b8);
            }
            else {
              times::times((times *)local_13b8,(tms *)os);
              std::vector<lest::test,_std::allocator<lest::test>_>::vector
                        (&local_1498,specification);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_14b0,&local_1508);
              __buffer = (tms *)local_14b0;
              ptVar7 = for_test<lest::times>
                                 ((lest *)&local_1498,(tests *)__buffer,(texts *)local_13b8,
                                  (times *)0x1,in_R8D);
              iVar5 = ptVar7->failures;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_14b0);
              std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_1498);
              times::~times((times *)local_13b8,__buffer);
            }
            goto LAB_0010b9f9;
          }
          local_13a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_13b8 + 0x10);
          local_13a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_13b8._8_8_ = (_Base_ptr)0x0;
          local_13b8._16_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          uStack_1388 = 0;
          local_13b8._0_8_ = os;
          local_13a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_13a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_1468,specification);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1480,&local_1508);
          for_test<lest::ptags>
                    ((lest *)&local_1468,&local_1480,(texts *)local_13b8,(ptags *)0x1,in_R8D);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1480);
          std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_1468);
          ptags::~ptags((ptags *)local_13b8);
        }
        else {
          local_13b8._0_8_ = os;
          std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_1438,specification);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1450,&local_1508);
          for_test<lest::print>
                    ((lest *)&local_1438,&local_1450,(texts *)local_13b8,(print *)0x1,in_R8D);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1450);
          std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_1438);
        }
      }
      else {
        local_13b8._8_8_ = local_13b8._8_8_ & 0xffffffff00000000;
        local_13b8._0_8_ = os;
        std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_1408,specification);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1420,&local_1508);
        for_test<lest::count>
                  ((lest *)&local_1408,&local_1420,(texts *)local_13b8,(count *)0x1,in_R8D);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1420);
        std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_1408);
        count::~count((count *)local_13b8);
      }
      iVar5 = 0;
    }
    else {
      iVar5 = version(os);
    }
  }
  else {
    iVar5 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (os,
               "\nUsage: test [options] [test-spec ...]\n\nOptions:\n  -h, --help         this help message\n  -a, --abort        abort at first failure\n  -c, --count        count selected tests\n  -g, --list-tags    list tags of selected tests\n  -l, --list-tests   list selected tests\n  -p, --pass         also report passing tests\n  -z, --pass-zen     ... without expansion\n  -t, --time         list duration of selected tests\n  -v, --verbose      also report passing or failing sections\n  --order=declared   use source code test order (default)\n  --order=lexical    use lexical sort test order\n  --order=random     use random test order\n  --random-seed=n    use n for random generator seed\n  --random-seed=time use time for random generator seed\n  --repeat=n         repeat selected tests n times (-1: indefinite)\n  --version          report lest version and compiler used\n  --                 end options\n\nTest specification:\n  \"@\", \"*\" all tests, unless excluded\n  empty    all tests, unless tagged [hide] or [.optional-name]\n  \"text\"   select tests that contain text (case insensitive)\n  \"!text\"  omit tests that contain text (case insensitive)\n"
               ,0x469);
  }
LAB_0010b9f9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1508);
  return iVar5;
}

Assistant:

inline int run( tests specification, texts arguments, std::ostream & os = std::cout )
{
    try
    {
        options option; texts in;
        tie( option, in ) = split_arguments( arguments );

        if ( option.lexical ) {    sort( specification         ); }
        if ( option.random  ) { shuffle( specification, option ); }

        if ( option.help    ) { return usage  ( os ); }
        if ( option.version ) { return version( os ); }
        if ( option.count   ) { count count_( os         ); return for_test( specification, in, count_ ); }
        if ( option.list    ) { print print_( os         ); return for_test( specification, in, print_ ); }
        if ( option.tags    ) { ptags ptags_( os         ); return for_test( specification, in, ptags_ ); }
        if ( option.time    ) { times times_( os, option ); return for_test( specification, in, times_ ); }

        { confirm confirm_( os, option ); return for_test( specification, in, confirm_, option.repeat ); }
    }
    catch ( std::exception const & e )
    {
        os << "Error: " << e.what() << "\n";
        return 1;
    }
}